

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O3

ssize_t __thiscall Tag::read(Tag *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer *pppSVar1;
  StreamObject *pSVar2;
  iterator __position;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  undefined4 extraout_var;
  ulong uVar8;
  undefined8 unaff_RBP;
  undefined7 uVar9;
  undefined4 in_register_00000034;
  stringstream *f;
  pointer ppSVar10;
  int iVar11;
  long lVar12;
  string s;
  stringstream stream;
  uint local_204;
  undefined1 local_200 [36];
  int local_1dc;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  f = (stringstream *)CONCAT44(in_register_00000034,__fd);
  this->_numberOfLines = 0;
  bVar4 = getOpenTag(this,f);
  local_204 = (uint)bVar4;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pSVar2 = (StreamObject *)(local_200 + 0x10);
  local_1dc = 0;
  do {
    if (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 2) != 0) break;
    local_200._8_8_ = 0;
    local_200[0x10] = '\0';
    local_200._0_8_ = pSVar2;
    std::operator>>((istream *)f,(string *)local_200);
    bVar4 = getCloseTag(this,(string *)local_200);
    if (bVar4) {
LAB_0010649d:
      bVar4 = false;
    }
    else if (((*(char *)local_200._0_8_ == '<') &&
             (*(char *)(local_200._0_8_ + (local_200._8_8_ - 1)) == '>')) ||
            (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 2) != 0)) {
      std::__cxx11::stringbuf::str();
      _Var3._M_p = local_1d8._M_dataplus._M_p;
      uVar9 = (undefined7)((ulong)unaff_RBP >> 8);
      if (local_200._8_8_ == local_1d8._M_string_length) {
        if (local_200._8_8_ == 0) {
          unaff_RBP = 0;
        }
        else {
          iVar11 = bcmp((void *)local_200._0_8_,local_1d8._M_dataplus._M_p,local_200._8_8_);
          unaff_RBP = CONCAT71(uVar9,iVar11 != 0);
        }
      }
      else {
        unaff_RBP = CONCAT71(uVar9,1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != &local_1d8.field_2) {
        operator_delete(_Var3._M_p,local_1d8.field_2._0_8_ + 1);
      }
      bVar4 = true;
      if ((char)unaff_RBP != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Syntax error: \"</",0x11);
        StreamObject::getName_abi_cxx11_(&local_1d8,&this->super_StreamObject);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_1d8._M_dataplus._M_p,
                            local_1d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,">\" missing.",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._0_8_ + 1);
        }
        local_204 = 0;
        goto LAB_0010649d;
      }
    }
    else {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_200._0_8_,local_200._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      local_1dc = local_1dc + 1;
      bVar4 = true;
    }
    if ((StreamObject *)local_200._0_8_ != pSVar2) {
      operator_delete((void *)local_200._0_8_,CONCAT71(local_200._17_7_,local_200[0x10]) + 1);
    }
  } while (bVar4);
  if (local_204 == 0) {
LAB_00106641:
    if ((local_204 & 1) != 0) {
      local_204 = (*(this->super_StreamObject)._vptr_StreamObject[3])(this);
    }
    if ((local_204 & 1) != 0) {
      uVar8 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      Object::setInitState(&(this->super_StreamObject).super_Object,true);
      goto LAB_0010666a;
    }
  }
  else {
    uVar8 = (long)local_1dc / (long)this->_lineSize;
    uVar7 = uVar8 & 0xffffffff;
    if (local_1dc % this->_lineSize == 0) {
      iVar11 = (int)uVar8;
      this->_numberOfLines = iVar11;
      if (1 < iVar11) {
        uVar8 = (ulong)(uint)this->_lineSize;
        iVar11 = 1;
        do {
          if (0 < (int)uVar8) {
            lVar12 = 0;
            do {
              iVar5 = (*(this->_streamObjects).
                        super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar12]->_vptr_StreamObject[2])();
              local_200._0_8_ = CONCAT44(extraout_var,iVar5);
              StreamObject::setOffset
                        ((StreamObject *)local_200._0_8_,this->_lineSize * iVar11 + (int)lVar12);
              __position._M_current =
                   (this->_streamObjects).
                   super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->_streamObjects).
                  super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<StreamObject*,std::allocator<StreamObject*>>::
                _M_realloc_insert<StreamObject*const&>
                          ((vector<StreamObject*,std::allocator<StreamObject*>> *)
                           &this->_streamObjects,__position,(StreamObject **)local_200);
              }
              else {
                *__position._M_current = (StreamObject *)local_200._0_8_;
                pppSVar1 = &(this->_streamObjects).
                            super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppSVar1 = *pppSVar1 + 1;
              }
              lVar12 = lVar12 + 1;
              uVar8 = (ulong)this->_lineSize;
            } while (lVar12 < (long)uVar8);
            uVar7 = (ulong)(uint)this->_numberOfLines;
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 < (int)uVar7);
      }
      ppSVar10 = (this->_streamObjects).
                 super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->_streamObjects).super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppSVar10) {
        uVar8 = 0;
        uVar7 = 1;
        do {
          if ((local_204 & 1) == 0) break;
          local_204 = (*ppSVar10[uVar8]->_vptr_StreamObject[1])(ppSVar10[uVar8],local_1b8);
          ppSVar10 = (this->_streamObjects).
                     super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          bVar4 = uVar7 < (ulong)((long)(this->_streamObjects).
                                        super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar10
                                 >> 3);
          uVar8 = uVar7;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (bVar4);
      }
      goto LAB_00106641;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Syntax error: wrong number of elements in \"<",0x2c);
    StreamObject::getName_abi_cxx11_((string *)local_200,&this->super_StreamObject);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_200._0_8_,local_200._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,">\"-Tag.",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((StreamObject *)local_200._0_8_ != pSVar2) {
      operator_delete((void *)local_200._0_8_,CONCAT71(local_200._17_7_,local_200[0x10]) + 1);
    }
  }
  uVar8 = 0;
LAB_0010666a:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return uVar8 & 0xffffffff;
}

Assistant:

bool Tag::read( std::stringstream &f )
{
	bool success = true;

	_numberOfLines = 0;

	success = getOpenTag( f );

	int numberOfElements = 0;

	std::stringstream stream;

	while ( ! f.eof() )
	{
		std::string s;
		f >> s;
		if ( getCloseTag( s ) )
		{
			break;
		}
		else
		{
			if (( s[0] == '<' ) && ( s[s.size()-1] == '>' ) || f.eof() )
			{
				if ( s != stream.str() )
				{
					std::cerr << "Syntax error: \"</" << getName() << ">\" missing." << std::endl;
					success = false;
					break;
				}
			}
			else
			{
				stream << s << std::endl;
				numberOfElements++;
			}
		}
	}

	if ( success )
	{
		if ( numberOfElements % lineSize() == 0 )
		{
			_numberOfLines = numberOfElements / lineSize();
		}
		else
		{
			std::cerr << "Syntax error: wrong number of elements in \"<" << getName() << ">\"-Tag." << std::endl;
			success = false;
		}
	}

	if ( success )
	{

		int offset = 0;

		for ( int j = 1; j < _numberOfLines; j++ )
		{
			for ( int i = 0; i < lineSize();i++ )
			{
				StreamObject *obj = elements()[i]->getInstance();

				offset = lineSize() * j;

				obj->setOffset( offset + i );

				elements().push_back( obj );
			}
		}

		for ( unsigned int i = 0; i < elements().size(); i++ )
		{
			if ( success )
			{
				success = _streamObjects[i]->read( stream );
			}
			else
			{
				break;
			}
		}
	}

	if ( success )
	{
		success = verify();
	}

	if ( success )
	{
		setInitState( true );
	}

	return success;
}